

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O1

int ffgpxvll(fitsfile *fptr,int datatype,LONGLONG *firstpix,LONGLONG nelem,void *nulval,void *array,
            int *anynul,int *status)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  LONGLONG *pLVar5;
  long *plVar6;
  LONGLONG *pLVar7;
  long *plVar8;
  long lVar9;
  LONGLONG firstelem;
  float fVar10;
  uchar nulval_00;
  char nulval_01;
  unsigned_short nulval_02;
  short nulval_03;
  double dVar11;
  char cdummy;
  double *local_130;
  double *local_128;
  int local_120;
  int naxis;
  LONGLONG local_118;
  long local_110;
  long local_108;
  LONGLONG naxes [9];
  long inc [9];
  
  pLVar5 = &DAT_001d7890;
  pLVar7 = &local_118;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pLVar7 = *pLVar5;
    pLVar5 = pLVar5 + 1;
    pLVar7 = pLVar7 + 1;
  }
  plVar6 = &DAT_001d7890;
  plVar8 = inc;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *plVar8 = *plVar6;
    plVar6 = plVar6 + 1;
    plVar8 = plVar8 + 1;
  }
  if (nelem == 0 || 0 < *status) {
    return *status;
  }
  local_130 = (double *)array;
  local_128 = (double *)nulval;
  local_120 = datatype;
  ffgidm(fptr,&naxis,status);
  ffgiszll(fptr,9,naxes,status);
  uVar4 = (ulong)(uint)naxis;
  if ((uVar4 == 0) || (naxes[0] == 0)) {
    *status = 0x140;
    return 0x140;
  }
  if (naxis < 1) {
    firstelem = 1;
  }
  else {
    memcpy(&local_118,firstpix,uVar4 * 8);
    lVar2 = 1;
    uVar3 = 0;
    lVar9 = 0;
    do {
      lVar9 = lVar9 + (firstpix[uVar3] + -1) * lVar2;
      lVar2 = lVar2 * naxes[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    firstelem = lVar9 + 1;
  }
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 != 0) {
    if ((((naxis & 0xfffffffeU) == 2) && (*firstpix == 1)) && (nelem % naxes[0] == 0)) {
      local_118 = naxes[0];
      for (local_110 = nelem / naxes[0] + firstpix[1] + -1; naxes[1] < local_110;
          local_110 = local_110 - naxes[1]) {
        local_108 = local_108 + 1;
      }
      fits_read_compressed_img
                (fptr,local_120,firstpix,&local_118,inc,1,local_128,local_130,(char *)0x0,anynul,
                 status);
    }
    else {
      fits_read_compressed_pixels
                (fptr,local_120,firstelem,nelem,1,local_128,local_130,(char *)0x0,anynul,status);
    }
    goto LAB_00144c3a;
  }
  if (local_120 < 0x28) {
    if (local_120 < 0x15) {
      if (local_120 == 0xb) {
        if (local_128 == (double *)0x0) {
          nulval_00 = '\0';
        }
        else {
          nulval_00 = *(uchar *)local_128;
        }
        ffgclb(fptr,2,1,firstelem,nelem,1,1,nulval_00,(uchar *)local_130,&cdummy,anynul,status);
        goto LAB_00144c3a;
      }
      if (local_120 == 0xc) {
        if (local_128 == (double *)0x0) {
          nulval_01 = '\0';
        }
        else {
          nulval_01 = *(char *)local_128;
        }
        ffgclsb(fptr,2,1,firstelem,nelem,1,1,nulval_01,(char *)local_130,&cdummy,anynul,status);
        goto LAB_00144c3a;
      }
      if (local_120 == 0x14) {
        if (local_128 == (double *)0x0) {
          nulval_02 = 0;
        }
        else {
          nulval_02 = *(unsigned_short *)local_128;
        }
        ffgclui(fptr,2,1,firstelem,nelem,1,1,nulval_02,(unsigned_short *)local_130,&cdummy,anynul,
                status);
        goto LAB_00144c3a;
      }
    }
    else {
      if (local_120 == 0x15) {
        if (local_128 == (double *)0x0) {
          nulval_03 = 0;
        }
        else {
          nulval_03 = *(short *)local_128;
        }
        ffgcli(fptr,2,1,firstelem,nelem,1,1,nulval_03,(short *)local_130,&cdummy,anynul,status);
        goto LAB_00144c3a;
      }
      if (local_120 == 0x1e) {
        if (local_128 == (double *)0x0) {
          fVar10 = 0.0;
        }
        else {
          fVar10 = *(float *)local_128;
        }
        ffgcluk(fptr,2,1,firstelem,nelem,1,1,(uint)fVar10,(uint *)local_130,&cdummy,anynul,status);
        goto LAB_00144c3a;
      }
      if (local_120 == 0x1f) {
        if (local_128 == (double *)0x0) {
          fVar10 = 0.0;
        }
        else {
          fVar10 = *(float *)local_128;
        }
        ffgclk(fptr,2,1,firstelem,nelem,1,1,(int)fVar10,(int *)local_130,&cdummy,anynul,status);
        goto LAB_00144c3a;
      }
    }
  }
  else if (local_120 < 0x50) {
    if (local_120 == 0x28) {
      if (local_128 == (double *)0x0) {
        dVar11 = 0.0;
      }
      else {
        dVar11 = *local_128;
      }
      ffgcluj(fptr,2,1,firstelem,nelem,1,1,(unsigned_long)dVar11,(unsigned_long *)local_130,&cdummy,
              anynul,status);
      goto LAB_00144c3a;
    }
    if (local_120 == 0x29) {
      if (local_128 == (double *)0x0) {
        dVar11 = 0.0;
      }
      else {
        dVar11 = *local_128;
      }
      ffgclj(fptr,2,1,firstelem,nelem,1,1,(long)dVar11,(long *)local_130,&cdummy,anynul,status);
      goto LAB_00144c3a;
    }
    if (local_120 == 0x2a) {
      if (local_128 == (double *)0x0) {
        fVar10 = 0.0;
      }
      else {
        fVar10 = *(float *)local_128;
      }
      ffgcle(fptr,2,1,firstelem,nelem,1,1,fVar10,(float *)local_130,&cdummy,anynul,status);
      goto LAB_00144c3a;
    }
  }
  else {
    if (local_120 == 0x50) {
      if (local_128 == (double *)0x0) {
        dVar11 = 0.0;
      }
      else {
        dVar11 = *local_128;
      }
      ffgclujj(fptr,2,1,firstelem,nelem,1,1,(ULONGLONG)dVar11,(ULONGLONG *)local_130,&cdummy,anynul,
               status);
      goto LAB_00144c3a;
    }
    if (local_120 == 0x51) {
      if (local_128 == (double *)0x0) {
        dVar11 = 0.0;
      }
      else {
        dVar11 = *local_128;
      }
      ffgcljj(fptr,2,1,firstelem,nelem,1,1,(LONGLONG)dVar11,(LONGLONG *)local_130,&cdummy,anynul,
              status);
      goto LAB_00144c3a;
    }
    if (local_120 == 0x52) {
      if (local_128 == (double *)0x0) {
        dVar11 = 0.0;
      }
      else {
        dVar11 = *local_128;
      }
      ffgcld(fptr,2,1,firstelem,nelem,1,1,dVar11,local_130,&cdummy,anynul,status);
      goto LAB_00144c3a;
    }
  }
  *status = 0x19a;
LAB_00144c3a:
  return *status;
}

Assistant:

int ffgpxvll( fitsfile *fptr, /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            LONGLONG *firstpix, /* I - coord of first pixel to read (1s based) */
            LONGLONG nelem,   /* I - number of values to read                */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    int naxis, ii;
    char cdummy;
    int nullcheck = 1;
    LONGLONG naxes[9], trc[9]= {1,1,1,1,1,1,1,1,1};
    long inc[9]= {1,1,1,1,1,1,1,1,1};
    LONGLONG dimsize = 1, firstelem;

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);

    ffgiszll(fptr, 9, naxes, status);

    if (naxis == 0 || naxes[0] == 0) {
       *status = BAD_DIMEN;
       return(*status);
    }

    /* calculate the position of the first element in the array */
    firstelem = 0;
    for (ii=0; ii < naxis; ii++)
    {
        firstelem += ((firstpix[ii] - 1) * dimsize);
        dimsize *= naxes[ii];
        trc[ii] = firstpix[ii];
    }
    firstelem++;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        /* test for special case of reading an integral number of */
        /* rows in a 2D or 3D image (which includes reading the whole image */

	if (naxis > 1 && naxis < 4 && firstpix[0] == 1 &&
            (nelem / naxes[0]) * naxes[0] == nelem) {

                /* calculate coordinate of last pixel */
		trc[0] = naxes[0];  /* reading whole rows */
		trc[1] = firstpix[1] + (nelem / naxes[0] - 1);
                while (trc[1] > naxes[1])  {
		    trc[1] = trc[1] - naxes[1];
		    trc[2] = trc[2] + 1;  /* increment to next plane of cube */
                }

                fits_read_compressed_img(fptr, datatype, firstpix, trc, inc,
                   1, nulval, array, NULL, anynul, status);

        } else {

                fits_read_compressed_pixels(fptr, datatype, firstelem,
                   nelem, nullcheck, nulval, array, NULL, anynul, status);
        }

        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgclb(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (unsigned char *) array, &cdummy, anynul, status);
      else
        ffgclb(fptr, 2, 1, firstelem, nelem, 1, 1, *(unsigned char *) nulval,
               (unsigned char *) array, &cdummy, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgclsb(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (signed char *) array, &cdummy, anynul, status);
      else
        ffgclsb(fptr, 2, 1, firstelem, nelem, 1, 1, *(signed char *) nulval,
               (signed char *) array, &cdummy, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgclui(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (unsigned short *) array, &cdummy, anynul, status);
      else
        ffgclui(fptr, 2, 1, firstelem, nelem, 1, 1, *(unsigned short *) nulval,
               (unsigned short *) array, &cdummy, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgcli(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (short *) array, &cdummy, anynul, status);
      else
        ffgcli(fptr, 2, 1, firstelem, nelem, 1, 1, *(short *) nulval,
               (short *) array, &cdummy, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgcluk(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (unsigned int *) array, &cdummy, anynul, status);
      else
        ffgcluk(fptr, 2, 1, firstelem, nelem, 1, 1, *(unsigned int *) nulval,
               (unsigned int *) array, &cdummy, anynul, status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgclk(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (int *) array, &cdummy, anynul, status);
      else
        ffgclk(fptr, 2, 1, firstelem, nelem, 1, 1, *(int *) nulval,
               (int *) array, &cdummy, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgcluj(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (unsigned long *) array, &cdummy, anynul, status);
      else
        ffgcluj(fptr, 2, 1, firstelem, nelem, 1, 1, *(unsigned long *) nulval,
               (unsigned long *) array, &cdummy, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgclj(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (long *) array, &cdummy, anynul, status);
      else
        ffgclj(fptr, 2, 1, firstelem, nelem, 1, 1, *(long *) nulval,
               (long *) array, &cdummy, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgclujj(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (ULONGLONG *) array, &cdummy, anynul, status);
      else
        ffgclujj(fptr, 2, 1, firstelem, nelem, 1, 1, *(ULONGLONG *) nulval,
               (ULONGLONG *) array, &cdummy, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgcljj(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (LONGLONG *) array, &cdummy, anynul, status);
      else
        ffgcljj(fptr, 2, 1, firstelem, nelem, 1, 1, *(LONGLONG *) nulval,
               (LONGLONG *) array, &cdummy, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgcle(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (float *) array, &cdummy, anynul, status);
      else
        ffgcle(fptr, 2, 1, firstelem, nelem, 1, 1, *(float *) nulval,
               (float *) array, &cdummy, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgcld(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (double *) array, &cdummy, anynul, status);
      else
        ffgcld(fptr, 2, 1, firstelem, nelem, 1, 1, *(double *) nulval,
               (double *) array, &cdummy, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}